

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeLibTests.cxx
# Opt level: O2

int main(int ac,char **av)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  clock_t cVar4;
  clock_t cVar5;
  functionMapEntry *pfVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  int testNum;
  char **local_40;
  char **local_38;
  
  testNum = 0;
  if (ac < 2) {
    puts("Available tests:");
    pfVar6 = cmakeGeneratedFunctionMapEntries;
    for (uVar10 = 0; uVar10 != 6; uVar10 = uVar10 + 1) {
      printf("%3d. %s\n",uVar10 & 0xffffffff,pfVar6->name);
      pfVar6 = pfVar6 + 1;
    }
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&testNum);
    if (iVar1 != 1) {
      pcVar9 = "Couldn\'t parse that input as a number";
      goto LAB_0012f8fb;
    }
    uVar10 = (ulong)(uint)testNum;
    if (5 < testNum) {
      pcVar9 = "%3d is an invalid test number.\n";
      goto LAB_0012f9e8;
    }
    ac = ac - 1;
    av = av + 1;
  }
  else {
    uVar10 = 0xffffffffffffffff;
  }
  local_40 = av;
  if (ac < 2 || (int)uVar10 != -1) {
    bVar11 = false;
    if ((int)uVar10 == -1) {
      uVar7 = 0;
      bVar11 = false;
      goto LAB_0012f92c;
    }
    bVar12 = true;
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = av[1];
    uVar7 = 0;
    bVar11 = false;
    if (*pcVar9 == '-') {
      uVar7 = 0;
      bVar11 = false;
      if (pcVar9[1] == 'R') {
        bVar11 = pcVar9[2] == '\0';
        if (bVar11 && (uint)ac < 3) {
          pcVar9 = "-R needs an additional parameter.";
LAB_0012f8fb:
          puts(pcVar9);
          return -1;
        }
        uVar7 = (ulong)(pcVar9[2] == '\0');
      }
      if ((pcVar9[1] == 'A') && (pcVar9[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",6);
        local_38 = av + 2;
        uVar10 = 0;
        while (uVar10 != 6) {
          pcVar9 = cmakeGeneratedFunctionMapEntries[uVar10].name;
          if (((uint)ac < 3) || (iVar1 = isTestSkipped(pcVar9,ac - 2,local_38), iVar1 == 0)) {
            cVar4 = clock();
            iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar10].func)(ac,local_40);
            cVar5 = clock();
            pcVar2 = "ok";
            if (iVar1 == -1) {
              pcVar2 = "not ok";
            }
            uVar10 = uVar10 + 1;
            printf("%s %d %s # %f\n",(double)(cVar5 - cVar4) / 1000000.0,pcVar2,uVar10 & 0xffffffff,
                   pcVar9);
          }
          else {
            uVar10 = uVar10 + 1;
            printf("ok %d %s # SKIP\n",uVar10 & 0xffffffff,pcVar9);
          }
        }
        puts("All tests finished.");
        return 0;
      }
    }
LAB_0012f92c:
    pcVar9 = lowercase(av[uVar7 + 1]);
    bVar12 = (int)uVar7 == 0;
  }
  pfVar6 = cmakeGeneratedFunctionMapEntries;
  for (uVar7 = 0; (uVar8 = (uint)uVar10, uVar8 == 0xffffffff && (uVar7 < 6)); uVar7 = uVar7 + 1) {
    pcVar2 = lowercase(pfVar6->name);
    if ((bVar11) && (pcVar3 = strstr(pcVar2,pcVar9), pcVar3 != (char *)0x0)) {
      ac = ac - 2;
      local_40 = local_40 + 2;
LAB_0012f9b8:
      uVar10 = uVar7 & 0xffffffff;
    }
    else {
      if ((bVar12) && (iVar1 = strcmp(pcVar2,pcVar9), iVar1 == 0)) {
        ac = ac - 1;
        local_40 = local_40 + 1;
        goto LAB_0012f9b8;
      }
      uVar10 = 0xffffffffffffffff;
    }
    free(pcVar2);
    pfVar6 = pfVar6 + 1;
  }
  free(pcVar9);
  if (uVar8 == 0xffffffff) {
    puts("Available tests:");
    pfVar6 = cmakeGeneratedFunctionMapEntries;
    for (uVar10 = 0; uVar10 != 6; uVar10 = uVar10 + 1) {
      printf("%3d. %s\n",uVar10 & 0xffffffff,pfVar6->name);
      pfVar6 = pfVar6 + 1;
    }
    printf("Failed: %s is an invalid test name.\n",local_40[1]);
    return -1;
  }
  if (uVar8 < 6) {
    iVar1 = (*cmakeGeneratedFunctionMapEntries[uVar10 & 0xffffffff].func)(ac,local_40);
    return iVar1;
  }
  pcVar9 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_0012f9e8:
  printf(pcVar9,(ulong)(uint)testNum);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}